

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O3

int Gia_ManAppendBuf(Gia_Man_t *p,int iLit)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  ulong uVar3;
  
  pGVar2 = Gia_ManAppendObj(p);
  if (iLit < 0) {
    __assert_fail("Lit >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                  ,0xf2,"int Abc_Lit2Var(int)");
  }
  if ((int)((uint)iLit >> 1) < p->nObjs) {
    pGVar1 = p->pObjs;
    if ((pGVar1 <= pGVar2) && (pGVar2 < pGVar1 + (uint)p->nObjs)) {
      uVar3 = (ulong)(((uint)((int)pGVar2 - (int)pGVar1) >> 2) * -0x55555555 - ((uint)iLit >> 1) &
                     0x1fffffff);
      *(ulong *)pGVar2 =
           (ulong)((iLit & 1U) << 0x1d) |
           (ulong)(iLit & 1U) << 0x3d | *(ulong *)pGVar2 & 0xc0000000c0000000 | uVar3 << 0x20 |
           uVar3;
      p->nBufs = p->nBufs + 1;
      pGVar1 = p->pObjs;
      if ((pGVar1 <= pGVar2) && (pGVar2 < pGVar1 + p->nObjs)) {
        return (int)((ulong)((long)pGVar2 - (long)pGVar1) >> 2) * 0x55555556;
      }
    }
    __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                  ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
  }
  __assert_fail("iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                ,0x2e3,"int Gia_ManAppendBuf(Gia_Man_t *, int)");
}

Assistant:

static inline int Gia_ManAppendBuf( Gia_Man_t * p, int iLit )  
{ 
    Gia_Obj_t * pObj = Gia_ManAppendObj( p );
    assert( iLit >= 0 && Abc_Lit2Var(iLit) < Gia_ManObjNum(p) );
    pObj->iDiff0  = pObj->iDiff1  = Gia_ObjId(p, pObj) - Abc_Lit2Var(iLit);
    pObj->fCompl0 = pObj->fCompl1 = Abc_LitIsCompl(iLit);
    p->nBufs++;
    return Gia_ObjId( p, pObj ) << 1;
}